

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInteract.c
# Opt level: O3

void ddClearLocal(DdNode *f)

{
  DdHalfWord DVar1;
  DdNode *pDVar2;
  
  DVar1 = f->index;
  while ((DVar1 != 0x7fffffff && (pDVar2 = (f->type).kids.T, ((ulong)pDVar2 & 1) != 0))) {
    pDVar2 = (DdNode *)((ulong)pDVar2 & 0xfffffffffffffffe);
    (f->type).kids.T = pDVar2;
    ddClearLocal(pDVar2);
    f = (DdNode *)((ulong)(f->type).kids.E & 0xfffffffffffffffe);
    DVar1 = f->index;
  }
  return;
}

Assistant:

static void
ddClearLocal(
  DdNode * f)
{
    if (cuddIsConstant(f) || !Cudd_IsComplement(cuddT(f))) {
        return;
    }
    /* clear visited flag */
    cuddT(f) = Cudd_Regular(cuddT(f));
    ddClearLocal(cuddT(f));
    ddClearLocal(Cudd_Regular(cuddE(f)));
    return;

}